

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_args(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  runtime_error *prVar6;
  byte __c;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = s->_M_string_length;
  if (uVar5 != 0) {
    bVar2 = true;
    bVar3 = true;
    uVar9 = 0;
    bVar7 = 0;
    do {
      pcVar1 = (s->_M_dataplus)._M_p;
      __c = pcVar1[uVar9];
      if (bVar7 == 0) {
        bVar8 = __c;
        if (__c < 0x27) {
          if ((__c != 0) && (__c != 0x22)) {
LAB_0010e9b4:
            iVar4 = isblank((int)(char)__c);
            if (iVar4 == 0) goto LAB_0010e9d7;
            bVar3 = bVar2;
            if (!bVar2) {
              bVar2 = true;
              bVar3 = true;
            }
            goto LAB_0010e9d2;
          }
        }
        else if (__c != 0x27) {
          if (__c == 0x5c) {
            if (uVar5 <= uVar9 + 1) {
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error(prVar6,"incomplete escape sequence");
              goto LAB_0010ea6d;
            }
            goto LAB_0010e9a9;
          }
          goto LAB_0010e9b4;
        }
      }
      else if (__c == bVar7) {
LAB_0010e9d2:
        bVar8 = 0;
      }
      else {
        if (__c == 0x5c) {
          if (uVar5 <= uVar9 + 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar6,"incomplete escape sequence");
LAB_0010ea6d:
            __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
LAB_0010e9a9:
          uVar9 = uVar9 + 1;
          __c = pcVar1[uVar9];
        }
        bVar8 = bVar7;
        if (__c == 0) goto LAB_0010ea0c;
LAB_0010e9d7:
        if (bVar3) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(__return_storage_ptr__);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1,__c);
          bVar3 = false;
          bVar2 = false;
          bVar8 = bVar7;
        }
        else {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1,__c);
          bVar8 = bVar7;
        }
      }
LAB_0010ea0c:
      uVar9 = uVar9 + 1;
      uVar5 = s->_M_string_length;
      bVar7 = bVar8;
    } while (uVar9 < uVar5);
    if (bVar8 != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar6,"unterminated quoted string");
      __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> split_args(const string& s) {
  vector<string> ret;
  char current_quote = 0;
  bool in_space_between_args = true;

  for (size_t z = 0; z < s.size(); z++) {
    bool can_be_space = true;
    char to_write = 0;
    if (current_quote) {
      can_be_space = false;
      if (s[z] == current_quote) {
        current_quote = 0;
      } else if (s[z] == '\\') {
        z++;
        if (z >= s.size()) {
          throw runtime_error("incomplete escape sequence");
        }
        to_write = s[z];
      } else {
        to_write = s[z];
      }
    } else if ((s[z] == '\"') || (s[z] == '\'')) {
      current_quote = s[z];
    } else if (s[z] == '\\') {
      can_be_space = false;
      z++;
      if (z >= s.size()) {
        throw runtime_error("incomplete escape sequence");
      }
      to_write = s[z];
    } else {
      to_write = s[z];
    }

    if (to_write) {
      bool is_space_between_args = can_be_space && isblank(to_write);
      if (is_space_between_args && in_space_between_args) {
        // Nothing
      } else if (!is_space_between_args && in_space_between_args) {
        // Start of another arg
        ret.emplace_back();
        if (to_write) {
          ret.back().push_back(to_write);
        }
        in_space_between_args = false;
      } else if (is_space_between_args && !in_space_between_args) {
        in_space_between_args = true;
      } else { // !is_space_between_args && !in_space_between_args
        ret.back().push_back(to_write);
      }
    }
  }

  if (current_quote) {
    throw runtime_error("unterminated quoted string");
  }

  return ret;
}